

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_resolveImportsInvalidInput_Test::TestBody
          (ModelFlattening_resolveImportsInvalidInput_Test *this)

{
  undefined1 uVar1;
  char *pcVar2;
  unsigned_long local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_40 [8];
  ImporterPtr importer;
  ModelPtr model;
  
  libcellml::Importer::create(SUB81(&importer,0));
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"not/used",(allocator<char> *)&local_80);
  uVar1 = libcellml::Importer::resolveImports
                    ((shared_ptr *)
                     importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(string *)&model);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,uVar1) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"importer->resolveImports(model, \"not/used\")","true")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x746,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_80 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(1)","importer->issueCount()",(unsigned_long *)&gtest_ar_,
             &local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x747,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Logger::issue((ulong)&local_80);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[39],std::__cxx11::string>
            ((internal *)&gtest_ar_,"\"Cannot resolve imports for null model.\"",
             "importer->issue(0)->description()",
             (char (*) [39])"Cannot resolve imports for null model.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x748,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, resolveImportsInvalidInput)
{
    auto importer = libcellml::Importer::create();

    libcellml::ModelPtr model = nullptr;

    EXPECT_FALSE(importer->resolveImports(model, "not/used"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ("Cannot resolve imports for null model.", importer->issue(0)->description());
}